

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O2

Value * __thiscall camp::Args::operator[](Args *this,size_t index)

{
  pointer pVVar1;
  long lVar2;
  OutOfRange *__return_storage_ptr__;
  allocator local_b2;
  allocator local_b1;
  string local_b0;
  string local_90;
  OutOfRange local_70;
  
  pVVar1 = (this->m_values).super__Vector_base<camp::Value,_std::allocator<camp::Value>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar2 = (long)(this->m_values).super__Vector_base<camp::Value,_std::allocator<camp::Value>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pVVar1;
  if (index < (ulong)(lVar2 / 0x38)) {
    return pVVar1 + index;
  }
  __return_storage_ptr__ = (OutOfRange *)__cxa_allocate_exception(0x48,index,lVar2 % 0x38);
  OutOfRange::OutOfRange
            (&local_70,index,
             ((long)(this->m_values).super__Vector_base<camp::Value,_std::allocator<camp::Value>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_values).super__Vector_base<camp::Value,_std::allocator<camp::Value>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x38);
  std::__cxx11::string::string
            ((string *)&local_90,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/args.cpp"
             ,&local_b1);
  std::__cxx11::string::string
            ((string *)&local_b0,"const Value &camp::Args::operator[](std::size_t) const",&local_b2)
  ;
  Error::prepare<camp::OutOfRange>(__return_storage_ptr__,&local_70,&local_90,0x60,&local_b0);
  __cxa_throw(__return_storage_ptr__,&OutOfRange::typeinfo,Error::~Error);
}

Assistant:

const Value& Args::operator[](std::size_t index) const
{
    // Make sure that the index is not out of range
    if (index >= m_values.size())
        CAMP_ERROR(OutOfRange(index, m_values.size()));

    return m_values[index];
}